

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRangeList.cpp
# Opt level: O0

DWARFAddressRangesVector * __thiscall
llvm::DWARFDebugRangeList::getAbsoluteRanges
          (DWARFAddressRangesVector *__return_storage_ptr__,DWARFDebugRangeList *this,
          Optional<llvm::object::SectionedAddress> BaseAddr)

{
  bool bVar1;
  reference this_00;
  SectionedAddress *pSVar2;
  undefined1 local_78 [8];
  DWARFAddressRange E;
  RangeListEntry *RLE;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
  *__range1;
  DWARFDebugRangeList *this_local;
  DWARFAddressRangesVector *Res;
  
  std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::vector
            (__return_storage_ptr__);
  __end1 = std::
           vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
           ::begin(&this->Entries);
  RLE = (RangeListEntry *)
        std::
        vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
        ::end(&this->Entries);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_llvm::DWARFDebugRangeList::RangeListEntry_*,_std::vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>_>
                                     *)&RLE), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_llvm::DWARFDebugRangeList::RangeListEntry_*,_std::vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>_>
              ::operator*(&__end1);
    bVar1 = RangeListEntry::isBaseAddressSelectionEntry(this_00,this->AddressSize);
    if (bVar1) {
      E.SectionIndex = this_00->EndAddress;
      Optional<llvm::object::SectionedAddress>::operator=
                (&BaseAddr,(SectionedAddress *)&E.SectionIndex);
    }
    else {
      local_78 = (undefined1  [8])this_00->StartAddress;
      E.LowPC = this_00->EndAddress;
      E.HighPC = this_00->SectionIndex;
      bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&BaseAddr);
      if (bVar1) {
        pSVar2 = Optional<llvm::object::SectionedAddress>::operator->(&BaseAddr);
        local_78 = (undefined1  [8])((long)local_78 + pSVar2->Address);
        pSVar2 = Optional<llvm::object::SectionedAddress>::operator->(&BaseAddr);
        E.LowPC = pSVar2->Address + E.LowPC;
        if (E.HighPC == 0xffffffffffffffff) {
          pSVar2 = Optional<llvm::object::SectionedAddress>::operator->(&BaseAddr);
          E.HighPC = pSVar2->SectionIndex;
        }
      }
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::push_back
                (__return_storage_ptr__,(value_type *)local_78);
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::DWARFDebugRangeList::RangeListEntry_*,_std::vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

DWARFAddressRangesVector DWARFDebugRangeList::getAbsoluteRanges(
    llvm::Optional<object::SectionedAddress> BaseAddr) const {
  DWARFAddressRangesVector Res;
  for (const RangeListEntry &RLE : Entries) {
    if (RLE.isBaseAddressSelectionEntry(AddressSize)) {
      BaseAddr = {RLE.EndAddress, RLE.SectionIndex};
      continue;
    }

    DWARFAddressRange E;
    E.LowPC = RLE.StartAddress;
    E.HighPC = RLE.EndAddress;
    E.SectionIndex = RLE.SectionIndex;
    // Base address of a range list entry is determined by the closest preceding
    // base address selection entry in the same range list. It defaults to the
    // base address of the compilation unit if there is no such entry.
    if (BaseAddr) {
      E.LowPC += BaseAddr->Address;
      E.HighPC += BaseAddr->Address;
      if (E.SectionIndex == -1ULL)
        E.SectionIndex = BaseAddr->SectionIndex;
    }
    Res.push_back(E);
  }
  return Res;
}